

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_block.cpp
# Opt level: O1

ByteData * __thiscall
cfd::core::Block::GetTxOutProof(ByteData *__return_storage_ptr__,Block *this,Txid *txid)

{
  initializer_list<cfd::core::Txid> __l;
  allocator_type local_51;
  Txid local_50;
  vector<cfd::core::Txid,_std::allocator<cfd::core::Txid>_> local_30;
  
  Txid::Txid(&local_50,txid);
  __l._M_len = 1;
  __l._M_array = &local_50;
  ::std::vector<cfd::core::Txid,_std::allocator<cfd::core::Txid>_>::vector(&local_30,__l,&local_51);
  GetTxOutProof(__return_storage_ptr__,this,&local_30);
  ::std::vector<cfd::core::Txid,_std::allocator<cfd::core::Txid>_>::~vector(&local_30);
  local_50._vptr_Txid = (_func_int **)&PTR__Txid_007e3348;
  if (local_50.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
      .super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_50.data_.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_50.data_.data_.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_50.data_.data_.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return __return_storage_ptr__;
}

Assistant:

ByteData Block::GetTxOutProof(const Txid& txid) const {
  return GetTxOutProof(std::vector<Txid>{txid});
}